

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

int rd_try_subblock(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
                   int is_last,int mi_row,int mi_col,BLOCK_SIZE subsize,RD_STATS best_rdcost,
                   RD_STATS *sum_rdc,PARTITION_TYPE partition,PICK_MODE_CONTEXT *this_ctx)

{
  int iVar1;
  RD_STATS best_rd;
  long lVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  RD_STATS rdcost_remaining;
  RD_STATS this_rdc;
  undefined4 uVar6;
  int *rate;
  long local_a0;
  undefined8 local_88;
  long lStack_80;
  long local_78;
  undefined8 uStack_70;
  undefined1 local_68;
  undefined7 uStack_67;
  RD_STATS local_58;
  
  iVar1 = (td->mb).rdmult;
  uVar6 = 0;
  setup_block_rdmult(cpi,&td->mb,mi_row,mi_col,subsize,'\0',(MB_MODE_INFO *)0x0);
  if ((((ulong)(uint)best_rdcost.rate == 0x7fffffff) || (best_rdcost.dist == 0x7fffffffffffffff)) ||
     (best_rdcost.rdcost == 0x7fffffffffffffff)) {
    local_a0 = 0x7fffffffffffffff;
LAB_001f13ec:
    local_88 = 0x7fffffff;
    lStack_80 = 0x7fffffffffffffff;
    local_78 = 0x7fffffffffffffff;
    uStack_70 = 0x7fffffffffffffff;
    local_68 = 0;
  }
  else {
    lVar2 = (long)(td->mb).rdmult;
    if (best_rdcost.rate < 0) {
      local_a0 = best_rdcost.dist * 0x80 -
                 ((long)((ulong)(uint)-best_rdcost.rate * lVar2 + 0x100) >> 9);
    }
    else {
      local_a0 = best_rdcost.dist * 0x80 +
                 ((long)((ulong)(uint)best_rdcost.rate * lVar2 + 0x100) >> 9);
    }
    if (((sum_rdc->rate == 0x7fffffff) || (sum_rdc->dist == 0x7fffffffffffffff)) ||
       ((local_a0 == 0x7fffffffffffffff || (sum_rdc->rdcost == 0x7fffffffffffffff))))
    goto LAB_001f13ec;
    lStack_80 = best_rdcost.dist - sum_rdc->dist;
    uVar3 = best_rdcost.rate - sum_rdc->rate;
    local_88 = CONCAT44(local_88._4_4_,uVar3);
    if ((int)uVar3 < 0) {
      local_78 = lStack_80 * 0x80 - ((long)((ulong)-uVar3 * lVar2 + 0x100) >> 9);
    }
    else {
      local_78 = lStack_80 * 0x80 + ((long)((ulong)uVar3 * lVar2 + 0x100) >> 9);
    }
  }
  best_rd._33_7_ = uStack_67;
  best_rd.skip_txfm = local_68;
  best_rd.dist = lStack_80;
  best_rd.rate = (undefined4)local_88;
  best_rd.zero_rate = local_88._4_4_;
  best_rd.rdcost = local_78;
  best_rd.sse = uStack_70;
  pick_sb_modes(cpi,tile_data,&td->mb,mi_row,mi_col,&local_58,partition,subsize,this_ctx,best_rd);
  if (local_58.rate == 0x7fffffff) {
    sum_rdc->rdcost = 0x7fffffffffffffff;
  }
  else {
    uVar3 = local_58.rate + sum_rdc->rate;
    sum_rdc->rate = uVar3;
    lVar2 = sum_rdc->dist + local_58.dist;
    sum_rdc->dist = lVar2;
    if ((lVar2 != 0x7fffffffffffffff && uVar3 != 0x7fffffff) &&
       (sum_rdc->rdcost != 0x7fffffffffffffff)) {
      lVar4 = (long)(td->mb).rdmult;
      if ((int)uVar3 < 0) {
        lVar2 = lVar2 * 0x80 - ((long)(lVar4 * (ulong)-uVar3 + 0x100) >> 9);
      }
      else {
        lVar2 = lVar2 * 0x80 + ((long)(lVar4 * (ulong)uVar3 + 0x100) >> 9);
      }
      sum_rdc->rdcost = lVar2;
      iVar5 = 0;
      if ((lVar2 < local_a0) && (iVar5 = 1, is_last == 0)) {
        rate = (int *)CONCAT44(uVar6,1);
        av1_update_state(cpi,td,this_ctx,mi_row,mi_col,subsize,'\x01');
        iVar5 = 1;
        encode_superblock(cpi,tile_data,td,tp,'\x01',subsize,rate);
      }
      goto LAB_001f1521;
    }
    sum_rdc->rate = 0x7fffffff;
    sum_rdc->zero_rate = 0;
    sum_rdc->dist = 0x7fffffffffffffff;
    sum_rdc->rdcost = 0x7fffffffffffffff;
    sum_rdc->sse = 0x7fffffffffffffff;
    sum_rdc->skip_txfm = '\0';
  }
  iVar5 = 0;
LAB_001f1521:
  (td->mb).rdmult = iVar1;
  return iVar5;
}

Assistant:

static int rd_try_subblock(AV1_COMP *const cpi, ThreadData *td,
                           TileDataEnc *tile_data, TokenExtra **tp, int is_last,
                           int mi_row, int mi_col, BLOCK_SIZE subsize,
                           RD_STATS best_rdcost, RD_STATS *sum_rdc,
                           PARTITION_TYPE partition,
                           PICK_MODE_CONTEXT *this_ctx) {
  MACROBLOCK *const x = &td->mb;
  const int orig_mult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, subsize, NO_AQ, NULL);

  av1_rd_cost_update(x->rdmult, &best_rdcost);

  RD_STATS rdcost_remaining;
  av1_rd_stats_subtraction(x->rdmult, &best_rdcost, sum_rdc, &rdcost_remaining);
  RD_STATS this_rdc;
  pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &this_rdc, partition,
                subsize, this_ctx, rdcost_remaining);

  if (this_rdc.rate == INT_MAX) {
    sum_rdc->rdcost = INT64_MAX;
  } else {
    sum_rdc->rate += this_rdc.rate;
    sum_rdc->dist += this_rdc.dist;
    av1_rd_cost_update(x->rdmult, sum_rdc);
  }

  if (sum_rdc->rdcost >= best_rdcost.rdcost) {
    x->rdmult = orig_mult;
    return 0;
  }

  if (!is_last) {
    av1_update_state(cpi, td, this_ctx, mi_row, mi_col, subsize, 1);
    encode_superblock(cpi, tile_data, td, tp, DRY_RUN_NORMAL, subsize, NULL);
  }

  x->rdmult = orig_mult;
  return 1;
}